

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ip-name.c
# Opt level: O0

int run_test_ip_name(void)

{
  sockaddr *src;
  int iVar1;
  uv_loop_t *puVar2;
  int64_t eval_b_11;
  int64_t eval_a_11;
  int64_t eval_b_10;
  int64_t eval_a_10;
  int64_t eval_b_9;
  int64_t eval_a_9;
  int64_t eval_b_8;
  int64_t eval_a_8;
  int64_t eval_b_7;
  int64_t eval_a_7;
  int64_t eval_b_6;
  int64_t eval_a_6;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  sockaddr_in6 *addr6;
  sockaddr_in *addr4;
  sockaddr *addr;
  TestAddr test_addr;
  char dst [46];
  
  src = (sockaddr *)((long)&addr + 4);
  iVar1 = uv_ip4_addr("192.168.0.1",0x23a3,(sockaddr_in *)((long)&addr + 4));
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ip-name.c"
            ,0x2b,"uv_ip4_addr(\"192.168.0.1\", 9123, addr4)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_ip4_name((sockaddr_in *)((long)&addr + 4),
                      (char *)(test_addr.addr6.sin6_addr.__in6_u.__u6_addr8 + 0xc),0x10);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ip-name.c"
            ,0x2c,"uv_ip4_name(addr4, dst, 16)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = strcmp("192.168.0.1",(char *)(test_addr.addr6.sin6_addr.__in6_u.__u6_addr8 + 0xc));
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ip-name.c"
            ,0x2d,"strcmp(\"192.168.0.1\", dst)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_ip_name(src,(char *)(test_addr.addr6.sin6_addr.__in6_u.__u6_addr8 + 0xc),0x10);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ip-name.c"
            ,0x2f,"uv_ip_name(addr, dst, 16)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = strcmp("192.168.0.1",(char *)(test_addr.addr6.sin6_addr.__in6_u.__u6_addr8 + 0xc));
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ip-name.c"
            ,0x30,"strcmp(\"192.168.0.1\", dst)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_ip6_addr("fe80::2acf:daff:fedd:342a",0x23a3,(sockaddr_in6 *)((long)&addr + 4));
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ip-name.c"
            ,0x33,"uv_ip6_addr(\"fe80::2acf:daff:fedd:342a\", 9123, addr6)","==","0",(long)iVar1,
            "==",0);
    abort();
  }
  iVar1 = uv_ip6_name((sockaddr_in6 *)((long)&addr + 4),
                      (char *)(test_addr.addr6.sin6_addr.__in6_u.__u6_addr8 + 0xc),0x2e);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ip-name.c"
            ,0x34,"uv_ip6_name(addr6, dst, 46)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = strcmp("fe80::2acf:daff:fedd:342a",
                 (char *)(test_addr.addr6.sin6_addr.__in6_u.__u6_addr8 + 0xc));
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ip-name.c"
            ,0x35,"strcmp(\"fe80::2acf:daff:fedd:342a\", dst)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_ip_name(src,(char *)(test_addr.addr6.sin6_addr.__in6_u.__u6_addr8 + 0xc),0x2e);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ip-name.c"
            ,0x37,"uv_ip_name(addr, dst, 46)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = strcmp("fe80::2acf:daff:fedd:342a",
                 (char *)(test_addr.addr6.sin6_addr.__in6_u.__u6_addr8 + 0xc));
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ip-name.c"
            ,0x38,"strcmp(\"fe80::2acf:daff:fedd:342a\", dst)","==","0",(long)iVar1,"==",0);
    abort();
  }
  addr._4_2_ = 1;
  iVar1 = uv_ip_name(src,(char *)(test_addr.addr6.sin6_addr.__in6_u.__u6_addr8 + 0xc),0x2e);
  if ((long)iVar1 != -0x61) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ip-name.c"
            ,0x3d,"UV_EAFNOSUPPORT","==","uv_ip_name(addr, dst, 46)",0xffffffffffffff9f,"==",
            (long)iVar1);
    abort();
  }
  puVar2 = uv_default_loop();
  close_loop(puVar2);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ip-name.c"
            ,0x3f,"0","==","uv_loop_close(uv_default_loop())",0,"==",(long)iVar1);
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(ip_name) {
    char dst[INET6_ADDRSTRLEN];
    union TestAddr test_addr;
    struct sockaddr* addr = &test_addr.addr;
    struct sockaddr_in* addr4 = &test_addr.addr4;
    struct sockaddr_in6* addr6 = &test_addr.addr6;

    /* test ip4_name */
    ASSERT_OK(uv_ip4_addr("192.168.0.1", TEST_PORT, addr4));
    ASSERT_OK(uv_ip4_name(addr4, dst, INET_ADDRSTRLEN));
    ASSERT_OK(strcmp("192.168.0.1", dst));

    ASSERT_OK(uv_ip_name(addr, dst, INET_ADDRSTRLEN));
    ASSERT_OK(strcmp("192.168.0.1", dst));

    /* test ip6_name */
    ASSERT_OK(uv_ip6_addr("fe80::2acf:daff:fedd:342a", TEST_PORT, addr6));
    ASSERT_OK(uv_ip6_name(addr6, dst, INET6_ADDRSTRLEN));
    ASSERT_OK(strcmp("fe80::2acf:daff:fedd:342a", dst));

    ASSERT_OK(uv_ip_name(addr, dst, INET6_ADDRSTRLEN));
    ASSERT_OK(strcmp("fe80::2acf:daff:fedd:342a", dst));

    /* test other sa_family */
    addr->sa_family = AF_UNIX;
    /* size is not a concern here */
    ASSERT_EQ(UV_EAFNOSUPPORT, uv_ip_name(addr, dst, INET6_ADDRSTRLEN));

    MAKE_VALGRIND_HAPPY(uv_default_loop());
    return 0;
}